

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O2

void __thiscall
language::_formatStackVariable
          (language *this,QTextStream *str,char *className,QStringView varName,
          bool withInitParameters)

{
  char cVar1;
  QTextStream *pQVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  if (_language == 1) {
    QVar4.m_data = (storage_type_conflict *)varName.m_size;
    QVar4.m_size = (qsizetype)className;
    pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)this,QVar4);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2," = ");
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(char *)str);
    QTextStream::operator<<(pQVar2,'(');
    cVar1 = ')';
    if ((char)varName.m_data == '\0') {
LAB_00148ed1:
      QTextStream::operator<<((QTextStream *)this,cVar1);
      return;
    }
  }
  else if (_language == 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)this,(char *)str);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,' ');
    QVar3.m_data = (storage_type_conflict *)varName.m_size;
    QVar3.m_size = (qsizetype)className;
    QTextStream::operator<<(pQVar2,QVar3);
    cVar1 = '(';
    if ((char)varName.m_data != '\0') goto LAB_00148ed1;
  }
  return;
}

Assistant:

void _formatStackVariable(QTextStream &str, const char *className, QStringView varName,
                          bool withInitParameters)
{
    switch (language()) {
    case Language::Cpp:
        str << className << ' ' << varName;
        if (withInitParameters)
            str << '(';
        break;
    case Language::Python:
        str << varName << " = " << className << '(';
        if (!withInitParameters)
            str << ')';
        break;
    }
}